

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::detail::Handle_Return<std::function<int_(int)>_&>::handle
          (Handle_Return<std::function<int_(int)>_&> *this,function<int_(int)> *f)

{
  Assignable_Proxy_Function_Impl<int_(int)> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar2;
  Boxed_Value BVar3;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_48;
  shared_ptr<std::function<int_(int)>_> local_38;
  
  this_00 = (Assignable_Proxy_Function_Impl<int_(int)> *)operator_new(0x40);
  local_38.super___shared_ptr<std::function<int_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.super___shared_ptr<std::function<int_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Assignable_Proxy_Function_Impl<int_(int)>::Assignable_Proxy_Function_Impl
            (this_00,(reference_wrapper<std::function<int_(int)>_>)f,&local_38);
  local_48.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>
            (&local_48.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(Proxy_Function_Base *)this_00);
  if (local_38.super___shared_ptr<std::function<int_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<std::function<int_(int)>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  sVar2 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base>
                    ((Object_Data *)this,&local_48,false);
  _Var1 = sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_48.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(std::function<Ret> &f) {
          return Boxed_Value(chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Assignable_Proxy_Function_Impl<Ret>>(
              std::ref(f), std::shared_ptr<std::function<Ret>>()));
        }